

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

void check_here(boolean picked_some)

{
  bool bVar1;
  int local_1c;
  boolean autoexploring;
  obj *poStack_18;
  int ct;
  obj *obj;
  boolean picked_some_local;
  
  local_1c = 0;
  bVar1 = false;
  if ((flags.run == 8) && (bVar1 = false, flags.travel != '\0')) {
    bVar1 = iflags.autoexplore != '\0';
  }
  for (poStack_18 = level->objects[u.ux][u.uy]; poStack_18 != (obj *)0x0;
      poStack_18 = (poStack_18->v).v_nexthere) {
    if (poStack_18 != uchain) {
      local_1c = local_1c + 1;
    }
  }
  if ((local_1c == 0) ||
     ((bVar1 && ((*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 2 & 1) != 0)))) {
    read_engr_at((int)u.ux,(int)u.uy);
  }
  else {
    if (flags.run != 0) {
      nomul(0,(char *)0x0);
    }
    flush_screen();
    look_here(local_1c,picked_some);
  }
  return;
}

Assistant:

static void check_here(boolean picked_some)
{
	struct obj *obj;
	int ct = 0;
	boolean autoexploring = (flags.run == 8 &&
				 flags.travel && iflags.autoexplore);

	/* count the objects here */
	for (obj = level->objects[u.ux][u.uy]; obj; obj = obj->nexthere) {
	    if (obj != uchain)
		ct++;
	}

	/* If there are objects here, take a look unless
	 * autoexploring a previously explored space. */
	if (ct && !(autoexploring && level->locations[u.ux][u.uy].mem_stepped)) {
	    if (flags.run) nomul(0, NULL);
	    flush_screen();
	    look_here(ct, picked_some);
	} else {
	    read_engr_at(u.ux,u.uy);
	}
}